

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::ShaderAtomicAddCase::verify
          (ShaderAtomicAddCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  bool bVar1;
  int iVar2;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar5;
  int in_stack_00000008;
  long in_stack_00000010;
  MessageBuilder local_870;
  _Self local_6f0;
  deUint32 local_6e4;
  _Self local_6e0;
  MessageBuilder local_6d8;
  _Base_ptr local_558;
  undefined1 local_550;
  MessageBuilder local_548;
  _Self local_3c8;
  _Self local_3c0;
  int local_3b4;
  MessageBuilder local_3b0;
  int local_22c;
  int local_228;
  int outputValue;
  int inputValue_1;
  int localNdx_1;
  MessageBuilder local_210;
  int local_90;
  int local_8c;
  int inputValue;
  int localNdx;
  int valueSum;
  bool maxFound;
  set<int,_std::less<int>,_std::allocator<int>_> outValues;
  int groupOutput;
  int groupOffset;
  int groupNdx;
  int numWorkGroups;
  int workGroupSize;
  void *outputs_local;
  size_t sStack_28;
  int outputStride_local;
  void *inputs_local;
  int inputStride_local;
  int numValues_local;
  ShaderAtomicAddCase *this_local;
  
  outputs_local._4_4_ = (int)tbs;
  inputs_local._4_4_ = (int)ctx;
  inputs_local._0_4_ = (int)sig;
  _numWorkGroups = tbslen;
  sStack_28 = siglen;
  _inputStride_local = this;
  groupNdx = product<unsigned_int,3>(&(this->super_ShaderAtomicOpCase).m_workGroupSize);
  groupOffset = inputs_local._4_4_ / groupNdx;
  for (groupOutput = 0; groupOutput < groupOffset; groupOutput = groupOutput + 1) {
    iVar2 = groupOutput * groupNdx;
    outValues._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
         *(int *)(in_stack_00000010 + groupOutput * in_stack_00000008);
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&valueSum);
    localNdx._3_1_ = 0;
    inputValue = (this->super_ShaderAtomicOpCase).m_initialValue;
    for (local_8c = 0; local_8c < groupNdx; local_8c = local_8c + 1) {
      local_90 = *(int *)(sStack_28 + (long)((int)inputs_local * (iVar2 + local_8c)));
      inputValue = local_90 + inputValue;
    }
    if (outValues._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == inputValue) {
      for (outputValue = 0; outputValue < groupNdx; outputValue = outputValue + 1) {
        local_228 = *(int *)(sStack_28 + (long)((int)inputs_local * (iVar2 + outputValue)));
        local_22c = *(int *)(_numWorkGroups + (long)(outputs_local._4_4_ * (iVar2 + outputValue)));
        bVar1 = de::inRange<int>(local_22c,(this->super_ShaderAtomicOpCase).m_initialValue,
                                 inputValue - local_228);
        if (!bVar1) {
          pTVar3 = tcu::TestContext::getLog
                             ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.
                              super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_3b0,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar4 = tcu::MessageBuilder::operator<<(&local_3b0,(char (*) [17])"ERROR: at group ");
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&groupOutput);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [14])", invocation ");
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&outputValue);
          pMVar4 = tcu::MessageBuilder::operator<<
                             (pMVar4,(char (*) [28])": expected value in range [");
          pMVar4 = tcu::MessageBuilder::operator<<
                             (pMVar4,&(this->super_ShaderAtomicOpCase).m_initialValue);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0xf95514);
          local_3b4 = inputValue - local_228;
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_3b4);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [8])0xf42ced);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_22c);
          tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_3b0);
          this_local._7_1_ = 0;
          inputValue_1 = 1;
          goto LAB_007272b7;
        }
        local_3c0._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::find
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)&valueSum,&local_22c);
        local_3c8._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::end
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)&valueSum);
        bVar1 = std::operator!=(&local_3c0,&local_3c8);
        if (bVar1) {
          pTVar3 = tcu::TestContext::getLog
                             ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.
                              super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_548,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar4 = tcu::MessageBuilder::operator<<(&local_548,(char (*) [17])"ERROR: at group ");
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&groupOutput);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [14])", invocation ");
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&outputValue);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [25])": found duplicate value ")
          ;
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_22c);
          tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_548);
          this_local._7_1_ = 0;
          inputValue_1 = 1;
          goto LAB_007272b7;
        }
        pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)&valueSum,&local_22c);
        local_558 = (_Base_ptr)pVar5.first._M_node;
        local_550 = pVar5.second;
        if (local_22c == inputValue - local_228) {
          localNdx._3_1_ = 1;
        }
      }
      if ((localNdx._3_1_ & 1) == 0) {
        pTVar3 = tcu::TestContext::getLog
                           ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_6d8,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (&local_6d8,
                            (char (*) [57])
                            "ERROR: could not find maximum expected value from group ");
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&groupOutput);
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_6d8);
        this_local._7_1_ = 0;
        inputValue_1 = 1;
      }
      else {
        local_6e4 = (this->super_ShaderAtomicOpCase).m_initialValue;
        local_6e0._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::find
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)&valueSum,
                        (key_type *)&local_6e4);
        local_6f0._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::end
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)&valueSum);
        bVar1 = std::operator==(&local_6e0,&local_6f0);
        if (bVar1) {
          pTVar3 = tcu::TestContext::getLog
                             ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.
                              super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_870,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar4 = tcu::MessageBuilder::operator<<
                             (&local_870,
                              (char (*) [48])"ERROR: could not find initial value from group ");
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&groupOutput);
          tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_870);
          this_local._7_1_ = 0;
          inputValue_1 = 1;
        }
        else {
          inputValue_1 = 0;
        }
      }
    }
    else {
      pTVar3 = tcu::TestContext::getLog
                         ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_210,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_210,(char (*) [17])"ERROR: at group ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&groupOutput);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [16])": expected sum ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&inputValue);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [7])0xf925e6);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(int *)((long)&outValues._M_t._M_impl.super__Rb_tree_header.
                                                _M_node_count + 4));
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_210);
      this_local._7_1_ = 0;
      inputValue_1 = 1;
    }
LAB_007272b7:
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&valueSum);
    if (inputValue_1 != 0) goto LAB_007272ed;
  }
  this_local._7_1_ = 1;
  inputValue_1 = groupOutput;
LAB_007272ed:
  return CONCAT31((int3)((uint)inputValue_1 >> 8),this_local._7_1_) & 0xffffff01;
}

Assistant:

bool verify (int numValues, int inputStride, const void* inputs, int outputStride, const void* outputs, int groupStride, const void* groupOutputs) const
	{
		const int	workGroupSize	= (int)product(m_workGroupSize);
		const int	numWorkGroups	= numValues/workGroupSize;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int	groupOffset		= groupNdx*workGroupSize;
			const int	groupOutput		= *(const deInt32*)((const deUint8*)groupOutputs + groupNdx*groupStride);
			set<int>	outValues;
			bool		maxFound		= false;
			int			valueSum		= (int)m_initialValue;

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const int inputValue = *(const deInt32*)((const deUint8*)inputs + inputStride*(groupOffset+localNdx));
				valueSum += inputValue;
			}

			if (groupOutput != valueSum)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ": expected sum " << valueSum << ", got " << groupOutput << TestLog::EndMessage;
				return false;
			}

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const int	inputValue		= *(const deInt32*)((const deUint8*)inputs + inputStride*(groupOffset+localNdx));
				const int	outputValue		= *(const deInt32*)((const deUint8*)outputs + outputStride*(groupOffset+localNdx));

				if (!de::inRange(outputValue, (int)m_initialValue, valueSum-inputValue))
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": expected value in range [" << m_initialValue << ", " << (valueSum-inputValue)
														   << "], got " << outputValue
									   << TestLog::EndMessage;
					return false;
				}

				if (outValues.find(outputValue) != outValues.end())
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": found duplicate value " << outputValue
									   << TestLog::EndMessage;
					return false;
				}

				outValues.insert(outputValue);
				if (outputValue == valueSum-inputValue)
					maxFound = true;
			}

			if (!maxFound)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: could not find maximum expected value from group " << groupNdx << TestLog::EndMessage;
				return false;
			}

			if (outValues.find((int)m_initialValue) == outValues.end())
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: could not find initial value from group " << groupNdx << TestLog::EndMessage;
				return false;
			}
		}

		return true;
	}